

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O3

void mzd_mul_v_uint64_128_640(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  bool bVar1;
  uint w;
  int iVar2;
  ulong uVar3;
  uint i_1;
  mzd_local_t *pmVar4;
  long lVar5;
  uint i;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  uint i_2;
  long lVar9;
  
  iVar2 = 2;
  c->w64[2] = 0;
  c->w64[3] = 0;
  c[1].w64[0] = 0;
  c[1].w64[1] = 0;
  c[1].w64[2] = 0;
  c[1].w64[3] = 0;
  c[2].w64[0] = 0;
  c[2].w64[1] = 0;
  c->w64[0] = 0;
  c->w64[1] = 0;
  c->w64[2] = 0;
  c->w64[3] = 0;
  c[1].w64[0] = 0;
  c[1].w64[1] = 0;
  c[1].w64[2] = 0;
  c[1].w64[3] = 0;
  do {
    uVar3 = v->w64[0];
    iVar6 = 0x40;
    do {
      lVar9 = 0;
      uVar7 = -(ulong)((uint)uVar3 & 1);
      bVar1 = true;
      do {
        bVar8 = bVar1;
        pmVar4 = A;
        lVar5 = 0;
        do {
          c[lVar9].w64[lVar5] = c[lVar9].w64[lVar5] ^ pmVar4->w64[lVar5] & uVar7;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        lVar9 = 1;
        A = pmVar4 + 1;
        bVar1 = false;
      } while (bVar8);
      lVar9 = 0;
      do {
        c[2].w64[lVar9] = c[2].w64[lVar9] ^ pmVar4[1].w64[lVar9] & uVar7;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 2);
      uVar3 = uVar3 >> 1;
      A = pmVar4 + 2;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    v = (mzd_local_t *)((long)v + 8);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

void mzd_mul_v_uint64_128_640(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  clear_uint64_blocks(BLOCK(c, 0), 2);
  clear_uint64_block(BLOCK(c, 2), 2);

  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; --i, idx >>= 1, ++Ablock) {
      const word mask = -(idx & 1);
      for (unsigned int j = 0; j < 2; ++j, ++Ablock) {
        mzd_xor_mask_uint64_block(BLOCK(c, j), Ablock, mask, 4);
      }
      mzd_xor_mask_uint64_block(BLOCK(c, 2), Ablock, mask, 2);
    }
  }
}